

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.h
# Opt level: O0

void __thiscall
VariableStruct::VariableStruct
          (VariableStruct *this,string *VarName,VARTYPE newType,VARCLASS newClass,int newOutput,
          int newParCount)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  int newParCount_local;
  int newOutput_local;
  VARCLASS newClass_local;
  VARTYPE newType_local;
  string *VarName_local;
  VariableStruct *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->CName);
  std::__cxx11::string::string((string *)&this->Prefix);
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(&this->ParList);
  this->Type = newType;
  this->Class = newClass;
  this->Output = newOutput;
  this->ParCount = newParCount;
  this->EverUsed = 0;
  std::__cxx11::string::operator=((string *)this,(string *)VarName);
  UpperCase(&this->BasicName);
  this->GlobalFlag = 0;
  bVar3 = true;
  if (this->Type == VARTYPE_DOUBLE) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = isdigit((int)*pcVar2);
    bVar3 = iVar1 == 0;
  }
  if (!bVar3) {
    __assert_fail("Type != 13 || isdigit(VarName.c_str()[0]) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/khandy21yo[P]btran/src/variable.h"
                  ,0x43,
                  "VariableStruct::VariableStruct(const std::string, VARTYPE, VARCLASS, int, int)");
  }
  this->Original = (Node *)0x0;
  return;
}

Assistant:

VariableStruct(
		const std::string VarName = "",		/**< Basic variable name */
		VARTYPE newType = VARTYPE_NONE,		/**< Type of variable */
		VARCLASS newClass = VARCLASS_NONE,	/**< Variable class */
		int newOutput = false,			/**< Has variable definition been output yet? */
		int newParCount = 0			/**< Parameter count */
	)
	{
		Type = newType;
		Class = newClass;
		Output = newOutput;
		ParCount = newParCount;
		EverUsed = 0;
		BasicName = VarName;
		UpperCase(BasicName);
		GlobalFlag = 0;
	  	assert(Type != 13 || isdigit(VarName.c_str()[0]) == 0);
		Original = 0;
	}